

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

Host * host_new(HostInit *init,Emulator *e)

{
  Result RVar1;
  Host *host;
  long lVar2;
  Host *pHVar3;
  byte bVar4;
  
  bVar4 = 0;
  host = (Host *)calloc(1,0x2c8);
  pHVar3 = host;
  for (lVar2 = 0xc; lVar2 != 0; lVar2 = lVar2 + -1) {
    (pHVar3->init).hooks.user_data = (init->hooks).user_data;
    init = (HostInit *)((long)init + (ulong)bVar4 * -0x10 + 8);
    pHVar3 = (Host *)((long)pHVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  (host->hook_ctx).host = host;
  (host->hook_ctx).e = e;
  (host->hook_ctx).user_data = (host->init).hooks.user_data;
  RVar1 = host_init(host,e);
  if (RVar1 != OK) {
    free(host);
    host = (Host *)0x0;
  }
  return host;
}

Assistant:

Host* host_new(const HostInit *init, Emulator* e) {
  Host* host = xcalloc(1, sizeof(Host));
  host->init = *init;
  host->hook_ctx.host = host;
  host->hook_ctx.e = e;
  host->hook_ctx.user_data = host->init.hooks.user_data;
  CHECK(SUCCESS(host_init(host, e)));
  return host;
error:
  xfree(host);
  return NULL;
}